

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

Data<QHashPrivate::Node<QWidget_*,_QRect>_> *
QHashPrivate::Data<QHashPrivate::Node<QWidget_*,_QRect>_>::detached
          (Data<QHashPrivate::Node<QWidget_*,_QRect>_> *d,size_t size)

{
  Data<QHashPrivate::Node<QWidget_*,_QRect>_> *this;
  
  this = (Data<QHashPrivate::Node<QWidget_*,_QRect>_> *)operator_new(0x28);
  if (d == (Data<QHashPrivate::Node<QWidget_*,_QRect>_> *)0x0) {
    Data(this,size);
  }
  else {
    Data(this,d,size);
    if ((d->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
      LOCK();
      (d->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (d->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((d->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
        ~Data(d);
        operator_delete(d,0x28);
      }
    }
  }
  return this;
}

Assistant:

static Data *detached(Data *d, size_t size)
    {
        if (!d)
            return new Data(size);
        Data *dd = new Data(*d, size);
        if (!d->ref.deref())
            delete d;
        return dd;
    }